

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

void __thiscall
cmsys::SystemInformationImplementation::RunCPUCheck(SystemInformationImplementation *this)

{
  int *piVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  long lVar6;
  ostream *poVar7;
  ulonglong uVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  string sStack_370;
  undefined1 *puStack_350;
  undefined8 uStack_348;
  undefined1 auStack_340 [16];
  string sStack_330;
  FILE *pFStack_310;
  string sStack_308;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> _Stack_2e8;
  string sStack_2d0;
  string sStack_2b0;
  string sStack_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_270;
  string sStack_250;
  string sStack_230;
  string sStack_210;
  string sStack_1f0;
  string sStack_1d0;
  string sStack_1b0;
  string sStack_190;
  string sStack_170;
  string sStack_150;
  string sStack_130;
  string sStack_110;
  string sStack_f0;
  string sStack_d0;
  string sStack_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_90;
  string sStack_70;
  string sStack_50;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  puStack_350 = auStack_340;
  uStack_348 = 0;
  auStack_340[0] = 0;
  __stream = fopen64("/proc/cpuinfo","r");
  pFStack_310 = __stream;
  if (__stream == (FILE *)0x0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"Problem opening /proc/cpuinfo");
    std::endl<char,std::char_traits<char>>(poVar7);
    goto LAB_003d7eb0;
  }
  while (iVar4 = feof(__stream), iVar4 == 0) {
    fgetc(__stream);
    std::__cxx11::string::push_back((char)&puStack_350);
  }
  fclose(__stream);
  std::__cxx11::string::resize((ulong)&puStack_350);
  while (lVar6 = std::__cxx11::string::find((char *)&puStack_350,0x4a89b7), lVar6 != -1) {
    this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
  }
  std::__cxx11::string::string((string *)&sStack_b0,(string *)&puStack_350);
  ExtractValueFromCpuInfoFile(&sStack_290,this,&sStack_b0,"physical id",0);
  std::__cxx11::string::~string((string *)&sStack_b0);
  iVar4 = -1;
  while (this->CurrentPositionInFile != 0xffffffffffffffff) {
    iVar5 = atoi(sStack_290._M_dataplus._M_p);
    if (iVar4 < iVar5) {
      iVar4 = iVar5;
    }
    std::__cxx11::string::string((string *)&sStack_50,(string *)&puStack_350);
    ExtractValueFromCpuInfoFile
              (&sStack_2b0,this,&sStack_50,"physical id",this->CurrentPositionInFile + 1);
    std::__cxx11::string::operator=((string *)&sStack_290,(string *)&sStack_2b0);
    std::__cxx11::string::~string((string *)&sStack_2b0);
    std::__cxx11::string::~string((string *)&sStack_50);
  }
  std::__cxx11::string::string((string *)&sStack_d0,(string *)&puStack_350);
  ExtractValueFromCpuInfoFile(&sStack_2b0,this,&sStack_d0,"cpu cores",0);
  std::__cxx11::string::~string((string *)&sStack_d0);
  if (iVar4 < 1) {
    std::__cxx11::string::string((string *)&sStack_f0,(string *)&puStack_350);
    ExtractValueFromCpuInfoFile(&sStack_2d0,this,&sStack_f0,"ncpus active",0);
    uVar9 = atoi(sStack_2d0._M_dataplus._M_p);
    this->NumberOfPhysicalCPU = uVar9;
    std::__cxx11::string::~string((string *)&sStack_2d0);
    std::__cxx11::string::~string((string *)&sStack_f0);
    uVar9 = this->NumberOfPhysicalCPU;
  }
  else {
    iVar5 = atoi(sStack_2b0._M_dataplus._M_p);
    uVar9 = (iVar4 + 1) * iVar5;
    this->NumberOfPhysicalCPU = uVar9;
  }
  uVar10 = (ulong)uVar9;
  if (uVar9 == 0) {
    this->NumberOfPhysicalCPU = 1;
    uVar10 = 1;
  }
  (this->Features).ExtendedFeatures.LogicalProcessorsPerPhysical =
       (uint)(this->NumberOfLogicalCPU / uVar10);
  std::__cxx11::string::string((string *)&sStack_110,(string *)&puStack_350);
  ExtractValueFromCpuInfoFile(&sStack_2d0,this,&sStack_110,"cpu MHz",0);
  std::__cxx11::string::~string((string *)&sStack_110);
  if (sStack_2d0._M_string_length == 0) {
    std::__cxx11::string::string((string *)&sStack_130,(string *)&puStack_350);
    ExtractValueFromCpuInfoFile(&sStack_308,this,&sStack_130,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&sStack_2d0,(string *)&sStack_308);
    std::__cxx11::string::~string((string *)&sStack_308);
    std::__cxx11::string::~string((string *)&sStack_130);
    uVar8 = strtoull(sStack_2d0._M_dataplus._M_p,(char **)0x0,0x10);
    fVar11 = (float)uVar8 / 1e+06;
  }
  else {
    dVar2 = atof(sStack_2d0._M_dataplus._M_p);
    fVar11 = (float)dVar2;
  }
  this->CPUSpeedInMHz = fVar11;
  std::__cxx11::string::string((string *)&sStack_150,(string *)&puStack_350);
  ExtractValueFromCpuInfoFile(&sStack_308,this,&sStack_150,"cpu family",0);
  std::__cxx11::string::~string((string *)&sStack_150);
  if (sStack_308._M_string_length == 0) {
    std::__cxx11::string::string((string *)&sStack_170,(string *)&puStack_350);
    ExtractValueFromCpuInfoFile(&sStack_330,this,&sStack_170,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&sStack_308,(string *)&sStack_330);
    std::__cxx11::string::~string((string *)&sStack_330);
    std::__cxx11::string::~string((string *)&sStack_170);
  }
  iVar4 = atoi(sStack_308._M_dataplus._M_p);
  (this->ChipID).Family = iVar4;
  std::__cxx11::string::string((string *)&sStack_190,(string *)&puStack_350);
  ExtractValueFromCpuInfoFile(&sStack_330,this,&sStack_190,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(this->ChipID).Vendor,(string *)&sStack_330);
  std::__cxx11::string::~string((string *)&sStack_330);
  std::__cxx11::string::~string((string *)&sStack_190);
  FindManufacturer(this,&sStack_308);
  if (((this->ChipID).Family == 0) && (this->ChipManufacturer == HP)) {
    bVar3 = std::operator==(&sStack_308,"PA-RISC 1.1a");
    iVar4 = 0x11a;
    if (!bVar3) {
      bVar3 = std::operator==(&sStack_308,"PA-RISC 2.0");
      iVar4 = 0x200;
      if (!bVar3) goto LAB_003d795a;
    }
    (this->ChipID).Family = iVar4;
  }
LAB_003d795a:
  std::__cxx11::string::string((string *)&sStack_1b0,(string *)&puStack_350);
  ExtractValueFromCpuInfoFile(&sStack_330,this,&sStack_1b0,"model",0);
  iVar4 = atoi(sStack_330._M_dataplus._M_p);
  (this->ChipID).Model = iVar4;
  std::__cxx11::string::~string((string *)&sStack_330);
  std::__cxx11::string::~string((string *)&sStack_1b0);
  bVar3 = RetrieveClassicalCPUIdentity(this);
  if (!bVar3) {
    std::__cxx11::string::string((string *)&sStack_1d0,(string *)&puStack_350);
    ExtractValueFromCpuInfoFile(&sStack_330,this,&sStack_1d0,"cpu",0);
    std::__cxx11::string::~string((string *)&sStack_1d0);
    if (sStack_330._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(this->ChipID).ProcessorName);
    }
    std::__cxx11::string::~string((string *)&sStack_330);
  }
  std::__cxx11::string::string((string *)&sStack_1f0,(string *)&puStack_350);
  ExtractValueFromCpuInfoFile(&sStack_330,this,&sStack_1f0,"stepping",0);
  std::__cxx11::string::~string((string *)&sStack_1f0);
  if (sStack_330._M_string_length == 0) {
    std::__cxx11::string::string((string *)&sStack_210,(string *)&puStack_350);
    ExtractValueFromCpuInfoFile(&sStack_370,this,&sStack_210,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&sStack_330,(string *)&sStack_370);
    std::__cxx11::string::~string((string *)&sStack_370);
    std::__cxx11::string::~string((string *)&sStack_210);
  }
  iVar4 = atoi(sStack_330._M_dataplus._M_p);
  (this->ChipID).Revision = iVar4;
  std::__cxx11::string::string((string *)&sStack_230,(string *)&puStack_350);
  ExtractValueFromCpuInfoFile(&sStack_370,this,&sStack_230,"model name",0);
  std::__cxx11::string::assign((char *)&(this->ChipID).ModelName);
  std::__cxx11::string::~string((string *)&sStack_370);
  std::__cxx11::string::~string((string *)&sStack_230);
  _Stack_2e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Stack_2e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  _Stack_2e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  sStack_370._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&_Stack_2e8,(char **)&sStack_370);
  sStack_370._M_dataplus._M_p = "I-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&_Stack_2e8,(char **)&sStack_370);
  sStack_370._M_dataplus._M_p = "D-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&_Stack_2e8,(char **)&sStack_370);
  (this->Features).L1CacheSize = 0;
  for (uVar10 = 0;
      uVar10 < (ulong)((long)_Stack_2e8._M_impl.super__Vector_impl_data._M_finish -
                       (long)_Stack_2e8._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar10 = uVar10 + 1) {
    std::__cxx11::string::string((string *)&sStack_70,(string *)&puStack_350);
    ExtractValueFromCpuInfoFile
              (&sStack_370,this,&sStack_70,
               _Stack_2e8._M_impl.super__Vector_impl_data._M_start[uVar10],0);
    std::__cxx11::string::~string((string *)&sStack_70);
    if (sStack_370._M_string_length != 0) {
      lVar6 = std::__cxx11::string::find((char *)&sStack_370,0x4a8a7d);
      if (lVar6 != -1) {
        std::__cxx11::string::substr((ulong)&bStack_90,(ulong)&sStack_370);
        std::__cxx11::string::operator=((string *)&sStack_370,(string *)&bStack_90);
        std::__cxx11::string::~string((string *)&bStack_90);
      }
      iVar4 = atoi(sStack_370._M_dataplus._M_p);
      piVar1 = &(this->Features).L1CacheSize;
      *piVar1 = *piVar1 + iVar4;
    }
    std::__cxx11::string::~string((string *)&sStack_370);
  }
  std::__cxx11::string::string((string *)&sStack_250,(string *)&puStack_350);
  ExtractValueFromCpuInfoFile(&sStack_370,this,&sStack_250,"flags",0);
  std::__cxx11::string::~string((string *)&sStack_250);
  if (sStack_330._M_string_length != 0) {
    std::operator+(&bStack_270," ",&sStack_370);
    std::operator+(&bStack_90,&bStack_270," ");
    std::__cxx11::string::operator=((string *)&sStack_370,(string *)&bStack_90);
    std::__cxx11::string::~string((string *)&bStack_90);
    std::__cxx11::string::~string((string *)&bStack_270);
    lVar6 = std::__cxx11::string::find((char *)&sStack_370,0x4a8a81);
    if (lVar6 != -1) {
      (this->Features).HasFPU = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&sStack_370,0x4a8a87);
    if (lVar6 != -1) {
      (this->Features).HasTSC = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&sStack_370,0x4a8a8d);
    if (lVar6 != -1) {
      (this->Features).HasMMX = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&sStack_370,0x4a8a93);
    if (lVar6 != -1) {
      (this->Features).HasSSE = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&sStack_370,0x4a8a99);
    if (lVar6 != -1) {
      (this->Features).HasSSE2 = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&sStack_370,0x4a8aa0);
    if (lVar6 != -1) {
      (this->Features).HasAPIC = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&sStack_370,0x4a8aa7);
    if (lVar6 != -1) {
      (this->Features).HasCMOV = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&sStack_370,0x4a8aae);
    if (lVar6 != -1) {
      (this->Features).HasMTRR = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&sStack_370,0x4a8ab5);
    if (lVar6 != -1) {
      (this->Features).HasACPI = true;
    }
    lVar6 = std::__cxx11::string::find((char *)&sStack_370,0x4a8abc);
    if (lVar6 != -1) {
      (this->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  std::__cxx11::string::~string((string *)&sStack_370);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&_Stack_2e8);
  std::__cxx11::string::~string((string *)&sStack_330);
  std::__cxx11::string::~string((string *)&sStack_308);
  std::__cxx11::string::~string((string *)&sStack_2d0);
  std::__cxx11::string::~string((string *)&sStack_2b0);
  std::__cxx11::string::~string((string *)&sStack_290);
LAB_003d7eb0:
  std::__cxx11::string::~string((string *)&puStack_350);
  return;
}

Assistant:

void SystemInformationImplementation::RunCPUCheck()
{
#ifdef WIN32
  // Check to see if this processor supports CPUID.
  bool supportsCPUID = DoesCPUSupportCPUID();

  if (supportsCPUID)
    {
    // Retrieve the CPU details.
    RetrieveCPUIdentity();
    this->FindManufacturer();
    RetrieveCPUFeatures();
    }

  // These two may be called without support for the CPUID instruction.
  // (But if the instruction is there, they should be called *after*
  // the above call to RetrieveCPUIdentity... that's why the two if
  // blocks exist with the same "if (supportsCPUID)" logic...
  //
  if (!RetrieveCPUClockSpeed())
    {
    RetrieveClassicalCPUClockSpeed();
    }

  if (supportsCPUID)
    {
    // Retrieve cache information.
    if (!RetrieveCPUCacheDetails())
      {
      RetrieveClassicalCPUCacheDetails();
      }

    // Retrieve the extended CPU details.
    if (!RetrieveExtendedCPUIdentity())
      {
      RetrieveClassicalCPUIdentity();
      }

    RetrieveExtendedCPUFeatures();
    RetrieveCPUPowerManagement();

    // Now attempt to retrieve the serial number (if possible).
    RetrieveProcessorSerialNumber();
    }

  this->CPUCount();

#elif defined(__APPLE__)
  this->ParseSysCtl();
#elif defined (__SVR4) && defined (__sun)
  this->QuerySolarisProcessor();
#elif defined(__HAIKU__)
  this->QueryHaikuInfo();
#elif defined(__QNX__)
  this->QueryQNXProcessor();
#elif defined(__OpenBSD__) || defined(__FreeBSD__) || defined(__NetBSD__) || defined(__DragonFly__)
  this->QueryBSDProcessor();
#elif defined(__hpux)
  this->QueryHPUXProcessor();
#elif defined(__linux) || defined(__CYGWIN__)
  this->RetreiveInformationFromCpuInfoFile();
#else
  this->QueryProcessor();
#endif
}